

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O0

void cjson_minify_should_not_overflow_buffer(void)

{
  long lVar1;
  long in_FS_OFFSET;
  char local_1c [4];
  char local_18 [4];
  char pending_escape [3];
  char unclosed_multiline_comment [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pending_escape[0] = 'l';
  pending_escape[1] = 'a';
  pending_escape[2] = '\0';
  builtin_strncpy(local_18,"/* b",4);
  local_1c[2] = 0;
  local_1c[0] = '\"';
  local_1c[1] = '\\';
  cJSON_Minify(local_18);
  UnityAssertEqualString("",local_18,(char *)0x0,0x26);
  cJSON_Minify(local_1c);
  UnityAssertEqualString("\"\\",local_1c,(char *)0x0,0x29);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_minify_should_not_overflow_buffer(void)
{
    char unclosed_multiline_comment[] = "/* bla";
    char pending_escape[] = "\"\\";

    cJSON_Minify(unclosed_multiline_comment);
    TEST_ASSERT_EQUAL_STRING("", unclosed_multiline_comment);

    cJSON_Minify(pending_escape);
    TEST_ASSERT_EQUAL_STRING("\"\\", pending_escape);
}